

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * parse_function_body(dmr_C *C,token *token,symbol *decl,symbol_list **list)

{
  symbol *fn;
  symbol_list **ppsVar1;
  char *pcVar2;
  statement *stmt_00;
  token *ptVar3;
  undefined1 local_88 [8];
  ptr_list_iter stmtiter__;
  ptr_list_iter argiter__;
  symbol *arg;
  symbol *prev;
  statement **p;
  statement *stmt;
  symbol *base_type;
  symbol_list **old_symbol_list;
  symbol_list **list_local;
  symbol *decl_local;
  token *token_local;
  dmr_C *C_local;
  
  fn = (decl->field_14).field_2.ctype.base_type;
  ppsVar1 = C->P->function_symbol_list;
  if (((decl->field_14).field_2.ctype.modifiers & 0x40000) == 0) {
    C->P->function_symbol_list = (symbol_list **)((long)&decl->field_14 + 0x50);
    prev = (symbol *)((long)&fn->field_14 + 0x48);
  }
  else {
    C->P->function_symbol_list = (symbol_list **)((long)&decl->field_14 + 0x60);
    prev = (symbol *)((long)&fn->field_14 + 0x58);
  }
  C->P->function_computed_target_list = (symbol_list *)0x0;
  C->P->function_computed_goto_list = (statement_list *)0x0;
  if ((((decl->field_14).field_2.ctype.modifiers & 8) != 0) &&
     (((decl->field_14).field_2.ctype.modifiers & 0x40000) == 0)) {
    pcVar2 = dmrC_show_ident(C,decl->ident);
    dmrC_warning(C,decl->pos,"function \'%s\' with external linkage has definition",pcVar2);
  }
  if (((decl->field_14).field_2.ctype.modifiers & 4) == 0) {
    (decl->field_14).field_2.ctype.modifiers = (decl->field_14).field_2.ctype.modifiers | 8;
  }
  stmt_00 = start_function(C,decl);
  *(statement **)prev = stmt_00;
  ptrlist_forward_iterator
            ((ptr_list_iter *)&stmtiter__.__nr,(ptr_list *)(fn->field_14).field_2.arguments);
  argiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&stmtiter__.__nr);
  while (argiter__._16_8_ != 0) {
    declare_argument(C,(symbol *)argiter__._16_8_,fn);
    argiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&stmtiter__.__nr);
  }
  ptVar3 = dmrC_compound_statement(C,token->next,stmt_00);
  end_function(C,decl);
  if (((decl->field_14).field_2.ctype.modifiers & 0x40000) == 0) {
    dmrC_add_symbol(C,list,decl);
  }
  dmrC_check_declaration(C->S,decl);
  (decl->field_14).field_2.definition = decl;
  arg = (decl->field_12).same_symbol;
  if ((arg == (symbol *)0x0) || ((arg->field_14).field_2.definition == (symbol *)0x0)) {
    for (; arg != (symbol *)0x0; arg = (arg->field_12).same_symbol) {
      dmrC_rebind_scope(C,arg,decl->scope);
      (arg->field_14).field_2.definition = decl;
    }
  }
  else {
    pcVar2 = dmrC_show_ident(C,decl->ident);
    dmrC_warning(C,decl->pos,"multiple definitions for function \'%s\'",pcVar2);
    dmrC_info(C,((arg->field_14).field_2.definition)->pos," the previous one is here");
  }
  C->P->function_symbol_list = ppsVar1;
  if (C->P->function_computed_goto_list != (statement_list *)0x0) {
    if (C->P->function_computed_target_list == (symbol_list *)0x0) {
      pcVar2 = dmrC_show_ident(C,decl->ident);
      dmrC_warning(C,decl->pos,"function \'%s\' has computed goto but no targets?",pcVar2);
    }
    else {
      ptrlist_forward_iterator
                ((ptr_list_iter *)local_88,(ptr_list *)C->P->function_computed_goto_list);
      p = (statement **)ptrlist_iter_next((ptr_list_iter *)local_88);
      while (p != (statement **)0x0) {
        p[4] = (statement *)C->P->function_computed_target_list;
        p = (statement **)ptrlist_iter_next((ptr_list_iter *)local_88);
      }
    }
  }
  ptVar3 = dmrC_expect_token(C,ptVar3,0x7d,"at end of function");
  return ptVar3;
}

Assistant:

static struct token *parse_function_body(struct dmr_C *C, struct token *token, struct symbol *decl,
	struct symbol_list **list)
{
	struct symbol_list **old_symbol_list;
	struct symbol *base_type = decl->ctype.base_type;
	struct statement *stmt, **p;
	struct symbol *prev;
	struct symbol *arg;

	old_symbol_list = C->P->function_symbol_list;
	if (decl->ctype.modifiers & MOD_INLINE) {
		C->P->function_symbol_list = &decl->inline_symbol_list;
		p = &base_type->inline_stmt;
	} else {
		C->P->function_symbol_list = &decl->symbol_list;
		p = &base_type->stmt;
	}
	C->P->function_computed_target_list = NULL;
	C->P->function_computed_goto_list = NULL;

	if (decl->ctype.modifiers & MOD_EXTERN) {
		if (!(decl->ctype.modifiers & MOD_INLINE))
			dmrC_warning(C, decl->pos, "function '%s' with external linkage has definition", dmrC_show_ident(C, decl->ident));
	}
	if (!(decl->ctype.modifiers & MOD_STATIC))
		decl->ctype.modifiers |= MOD_EXTERN;

	stmt = start_function(C, decl);

	*p = stmt;
	FOR_EACH_PTR (base_type->arguments, arg) {
		declare_argument(C, arg, base_type);
	} END_FOR_EACH_PTR(arg);

	token = dmrC_compound_statement(C, token->next, stmt);

	end_function(C, decl);
	if (!(decl->ctype.modifiers & MOD_INLINE))
		dmrC_add_symbol(C, list, decl);
	dmrC_check_declaration(C->S, decl);
	decl->definition = decl;
	prev = decl->same_symbol;
	if (prev && prev->definition) {
		dmrC_warning(C, decl->pos, "multiple definitions for function '%s'",
			dmrC_show_ident(C, decl->ident));
		dmrC_info(C, prev->definition->pos, " the previous one is here");
	} else {
		while (prev) {
			dmrC_rebind_scope(C, prev, decl->scope);
			prev->definition = decl;
			prev = prev->same_symbol;
		}
	}
	C->P->function_symbol_list = old_symbol_list;
	if (C->P->function_computed_goto_list) {
		if (!C->P->function_computed_target_list)
			dmrC_warning(C, decl->pos, "function '%s' has computed goto but no targets?", dmrC_show_ident(C, decl->ident));
		else {
			FOR_EACH_PTR(C->P->function_computed_goto_list, stmt) {
				stmt->target_list = C->P->function_computed_target_list;
			} END_FOR_EACH_PTR(stmt);
		}
	}
	return dmrC_expect_token(C, token, '}', "at end of function");
}